

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<bool>::UnpoisonBuffer(RepeatedField<bool> *this)

{
  bool bVar1;
  int old_size;
  int new_size;
  RepeatedField<bool> *this_local;
  
  old_size = size(this);
  new_size = Capacity(this);
  AnnotateSize(this,old_size,new_size);
  bVar1 = is_soo(this);
  if (bVar1) {
    internal::UnpoisonMemoryRegion((void *)((long)&(this->soo_rep_).field_0 + 8),8);
  }
  return;
}

Assistant:

void UnpoisonBuffer() const {
    AnnotateSize(size(), Capacity());
    if (is_soo()) {
      // We need to manually unpoison the SOO buffer because in reflection for
      // split repeated fields, we poison the whole SOO buffer even when we
      // don't actually use the whole SOO buffer (e.g. for RepeatedField<bool>).
      internal::UnpoisonMemoryRegion(soo_rep_.short_rep.data,
                                     sizeof(soo_rep_.short_rep.data));
    }
  }